

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.hh
# Opt level: O0

void __thiscall dtc::fdt::device_tree::device_tree(device_tree *this)

{
  device_tree *this_local;
  
  this->phandle_node_name = EPAPR;
  this->valid = true;
  this->garbage_collect = false;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&this->reservations);
  std::shared_ptr<dtc::fdt::node>::shared_ptr(&this->root);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>_>_>
  ::unordered_map(&this->node_names);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>_>_>
  ::unordered_map(&this->node_name_parents);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>_>_>
  ::unordered_map(&this->node_paths);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>_>_>
  ::vector(&this->ordered_node_paths);
  std::vector<dtc::fdt::property_value_*,_std::allocator<dtc::fdt::property_value_*>_>::vector
            (&this->cross_references);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->deletions);
  std::vector<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>::vector
            (&this->fixups);
  std::
  vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
  ::vector(&this->unresolved_fixups);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->phandle_targets);
  std::
  vector<std::unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_>,_std::allocator<std::unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_>_>_>
  ::vector(&this->buffers);
  std::
  unordered_map<unsigned_int,_std::shared_ptr<dtc::fdt::node>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>_>_>
  ::unordered_map(&this->used_phandles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->include_paths);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::property>_>_>_>
  ::unordered_map(&this->defines);
  this->boot_cpu = 0;
  this->spare_reserve_map_entries = 0;
  this->minimum_blob_size = 0;
  this->blob_padding = 0;
  this->is_plugin = false;
  this->write_symbols = false;
  return;
}

Assistant:

device_tree() {}